

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int IFN_Next_Word(FORM *form)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FIELD *pFVar4;
  char *pcVar5;
  
  pFVar4 = form->current;
  iVar1 = pFVar4->dcols;
  iVar2 = form->currow;
  pcVar5 = pFVar4->buf;
  iVar3 = form->curcol;
  Synchronize_Buffer(form);
  pcVar5 = Get_First_Whitespace_Character
                     (pcVar5 + (long)iVar3 + (long)iVar2 * (long)iVar1,
                      (*(int *)&pFVar4->buf -
                      (int)(pcVar5 + (long)iVar3 + (long)iVar2 * (long)iVar1)) +
                      pFVar4->dcols * pFVar4->drows);
  pcVar5 = Get_Start_Of_Data(pcVar5,(*(int *)&pFVar4->buf - (int)pcVar5) +
                                    pFVar4->dcols * pFVar4->drows);
  Adjust_Cursor_Position(form,pcVar5);
  return 0;
}

Assistant:

static int IFN_Next_Word(FORM * form)
{
  FIELD *field = form->current;
  char  *bp    = Address_Of_Current_Position_In_Buffer(form);
  char  *s;
  char  *t;

  /* We really need access to the data, so we have to synchronize */
  Synchronize_Buffer(form);

  /* Go to the first whitespace after the current position (including
     current position). This is then the startpoint to look for the
    next non-blank data */
  s = Get_First_Whitespace_Character(bp,Buffer_Length(field) -
                                     (int)(bp - field->buf));

  /* Find the start of the next word */
  t = Get_Start_Of_Data(s,Buffer_Length(field) -
                        (int)(s - field->buf));
#if !FRIENDLY_PREV_NEXT_WORD
  if (s==t) 
    return(E_REQUEST_DENIED);
  else
#endif
    {
      Adjust_Cursor_Position(form,t);
      return(E_OK);
    }
}